

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O0

int CascLoadEncryptionKeys(TCascStorage *hs)

{
  PCASC_MAP p_Var1;
  ulong local_38;
  size_t i;
  int nError;
  size_t nMaxItems;
  size_t nKeyCount;
  TCascStorage *hs_local;
  
  p_Var1 = Map_Create(0xf6,8,0);
  hs->pEncryptionKeys = p_Var1;
  if (hs->pEncryptionKeys == (PCASC_MAP)0x0) {
    hs_local._4_4_ = 0xc;
  }
  else {
    for (local_38 = 0; local_38 < 0x76; local_38 = local_38 + 1) {
      Map_InsertObject(hs->pEncryptionKeys,CascKeys + local_38,CascKeys + local_38);
    }
    hs_local._4_4_ = CASC_ARRAY::Create<_CASC_ENCRYPTION_KEY>(&hs->ExtraKeysList,0x80);
  }
  return hs_local._4_4_;
}

Assistant:

int CascLoadEncryptionKeys(TCascStorage * hs)
{
    size_t nKeyCount = (sizeof(CascKeys) / sizeof(CASC_ENCRYPTION_KEY));
    size_t nMaxItems = nKeyCount + CASC_EXTRA_KEYS;
    int nError;

    // Create fast map of KeyName -> Key
    hs->pEncryptionKeys = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_ENCRYPTION_KEY, KeyName));
    if (hs->pEncryptionKeys == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Insert all static keys
    for (size_t i = 0; i < nKeyCount; i++)
        Map_InsertObject(hs->pEncryptionKeys, &CascKeys[i], &CascKeys[i].KeyName);

    // Create array for extra keys
    nError = hs->ExtraKeysList.Create<CASC_ENCRYPTION_KEY>(CASC_EXTRA_KEYS);
    return nError;
}